

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O1

bool __thiscall
booster::locale::gnu_gettext::mo_message<char>::load_file
          (mo_message<char> *this,string *file_name,string *locale_encoding,string *key_encoding,
          int id,callback_type *callback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false> _Var4;
  undefined8 file;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  mo_file *pmVar8;
  size_t sVar9;
  mapped_type *pmVar10;
  runtime_error *this_00;
  char *__s;
  ulong uVar11;
  pair_type pVar12;
  unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
  mo;
  vector<char,_std::allocator<char>_> vfile;
  string mo_encoding;
  converter<char> cvt_value;
  string_type value;
  string_type skey;
  string plural;
  converter<char> cvt_key;
  _Head_base<0UL,_booster::locale::gnu_gettext::mo_file_*,_false> local_210;
  mo_message<char> *local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [72];
  char *local_1a8;
  char local_1a0 [16];
  converter<char> local_190;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  converter<char> local_70;
  
  std::__cxx11::string::_M_assign((string *)&this->locale_encoding_);
  std::__cxx11::string::_M_assign((string *)&this->key_encoding_);
  iVar6 = compare_encodings(this,locale_encoding,key_encoding);
  this->key_conversion_required_ = iVar6 != 0;
  local_210._M_head_impl = (mo_file *)0x0;
  local_208 = this;
  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
    local_200._0_8_ = (FILE *)0x0;
    c_file::open((c_file *)local_200,(char *)file_name,(int)locale_encoding);
    file = local_200._0_8_;
    if ((FILE *)local_200._0_8_ == (FILE *)0x0) goto LAB_001759e1;
    pmVar8 = (mo_file *)operator_new(0x48);
    mo_file::mo_file(pmVar8,(FILE *)file);
    std::
    __uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
    ::reset((__uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
             *)&local_210,pmVar8);
    if ((FILE *)local_200._0_8_ != (FILE *)0x0) {
      fclose((FILE *)local_200._0_8_);
      local_200._0_8_ = (FILE *)0x0;
    }
  }
  else {
    (*callback->_M_invoker)
              ((vector<char,_std::allocator<char>_> *)local_200,(_Any_data *)callback,file_name,
               locale_encoding);
    if (local_200._0_8_ == local_200._8_8_) {
      if ((FILE *)local_200._0_8_ != (FILE *)0x0) {
        operator_delete((void *)local_200._0_8_);
      }
LAB_001759e1:
      bVar5 = false;
      goto LAB_001759e3;
    }
    pmVar8 = (mo_file *)operator_new(0x48);
    mo_file::mo_file(pmVar8,(vector<char,_std::allocator<char>_> *)local_200);
    std::
    __uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
    ::reset((__uniq_ptr_impl<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
             *)&local_210,pmVar8);
    if ((FILE *)local_200._0_8_ != (FILE *)0x0) {
      operator_delete((void *)local_200._0_8_);
    }
  }
  pVar12 = mo_file::value(local_210._M_head_impl,0);
  std::__cxx11::string::string((string *)local_200,pVar12.first,(allocator *)&local_70);
  paVar1 = &local_190.out_.field_2;
  local_190.out_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"plural=","");
  extract(&local_90,(string *)local_200,&local_190.out_,"\r\n;");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.out_._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.out_._M_dataplus._M_p);
  }
  if ((FILE *)local_200._0_8_ != (FILE *)local_1f0) {
    operator_delete((void *)local_200._0_8_);
  }
  pVar12 = mo_file::value(local_210._M_head_impl,0);
  std::__cxx11::string::string((string *)local_200,pVar12.first,(allocator *)&local_70);
  local_190.out_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"charset=","");
  extract((string *)(local_1f0 + 0x40),(string *)local_200,&local_190.out_," \r\n;");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.out_._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.out_._M_dataplus._M_p);
  }
  if ((FILE *)local_200._0_8_ != (FILE *)local_1f0) {
    operator_delete((void *)local_200._0_8_);
  }
  if (local_1a8 == (char *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Invalid mo-format, encoding is not specified","");
    runtime_error::runtime_error(this_00,(string *)local_200);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  if (local_90._M_string_length != 0) {
    lambda::compile((lambda *)local_200,local_90._M_dataplus._M_p);
    std::__shared_ptr<booster::locale::gnu_gettext::lambda::plural,(__gnu_cxx::_Lock_policy)2>::
    operator=((__shared_ptr<booster::locale::gnu_gettext::lambda::plural,(__gnu_cxx::_Lock_policy)2>
               *)((local_208->plural_forms_).
                  super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + id),
              (unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
               *)local_200);
    if ((FILE *)local_200._0_8_ != (FILE *)0x0) {
      (**(code **)(*(long *)local_200._0_8_ + 0x18))();
    }
  }
  bVar5 = mo_useable_directly(local_208,(string *)(local_1f0 + 0x40),local_210._M_head_impl);
  if (bVar5) {
    std::__shared_ptr<booster::locale::gnu_gettext::mo_file,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<booster::locale::gnu_gettext::mo_file,(__gnu_cxx::_Lock_policy)2> *)
               ((local_208->mo_catalogs_).
                super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
                ._M_impl.super__Vector_impl_data._M_start + id),
               (unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                *)&local_210);
  }
  else {
    pcVar2 = (locale_encoding->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + locale_encoding->_M_string_length);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_1f0._64_8_,local_1a8 + local_1f0._64_8_);
    converter<char>::converter(&local_190,&local_b0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pcVar2 = (key_encoding->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + key_encoding->_M_string_length);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_1f0._64_8_,local_1a8 + local_1f0._64_8_);
    converter<char>::converter(&local_70,&local_f0,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((local_210._M_head_impl)->size_ != 0) {
      uVar11 = 0;
      iVar6 = 4;
      do {
        _Var4._M_head_impl = local_210._M_head_impl;
        uVar7 = mo_file::get(local_210._M_head_impl,(local_210._M_head_impl)->keys_offset_ + iVar6);
        __s = (_Var4._M_head_impl)->data_ + uVar7;
        sVar9 = strlen(__s);
        conv::between(&local_130,__s,__s + sVar9,&local_70.out_,&local_70.in_,stop);
        message_key<char>::message_key((message_key<char> *)local_200,&local_130);
        pVar12 = mo_file::value(local_210._M_head_impl,(int)uVar11);
        conv::between(&local_150,pVar12.first,pVar12.second,&local_190.out_,&local_190.in_,stop);
        pmVar10 = std::
                  map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((local_208->catalogs_).
                               super__Vector_base<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + id,(key_type *)local_200)
        ;
        std::__cxx11::string::swap((string *)pmVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((undefined1 *)local_1f0._16_8_ != local_1f0 + 0x20) {
          operator_delete((void *)local_1f0._16_8_);
        }
        if ((FILE *)local_200._0_8_ != (FILE *)local_1f0) {
          operator_delete((void *)local_200._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar6 = iVar6 + 8;
      } while (uVar11 < (local_210._M_head_impl)->size_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.in_._M_dataplus._M_p != &local_70.in_.field_2) {
      operator_delete(local_70.in_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.out_._M_dataplus._M_p != &local_70.out_.field_2) {
      operator_delete(local_70.out_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.in_._M_dataplus._M_p != &local_190.in_.field_2) {
      operator_delete(local_190.in_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.out_._M_dataplus._M_p != &local_190.out_.field_2) {
      operator_delete(local_190.out_._M_dataplus._M_p);
    }
  }
  if ((char *)local_1f0._64_8_ != local_1a0) {
    operator_delete((void *)local_1f0._64_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  bVar5 = true;
LAB_001759e3:
  _Var4._M_head_impl = local_210._M_head_impl;
  if (local_210._M_head_impl != (mo_file *)0x0) {
    pcVar3 = ((local_210._M_head_impl)->vdata_).super__Vector_base<char,_std::allocator<char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pcVar3 != (pointer)0x0) {
      operator_delete(pcVar3);
    }
    operator_delete(_Var4._M_head_impl);
  }
  return bVar5;
}

Assistant:

bool load_file( std::string const &file_name,
                                std::string const &locale_encoding,
                                std::string const &key_encoding,
                                int id,
                                messages_info::callback_type const &callback)
                {
                    locale_encoding_ = locale_encoding;
                    key_encoding_ = key_encoding;
                    
                    key_conversion_required_ =  sizeof(CharType) == 1 
                                                && compare_encodings(locale_encoding,key_encoding)!=0;

                    std::unique_ptr<mo_file> mo;

                    if(callback) {
                        std::vector<char> vfile = callback(file_name,locale_encoding);
                        if(vfile.empty()) 
                            return false;
                        mo.reset(new mo_file(vfile));
                    }
                    else {
                        c_file the_file;
                        the_file.open(file_name,locale_encoding);
                        if(!the_file.file)
                            return false;
                        mo.reset(new mo_file(the_file.file));
                    }
                    
                    std::string plural = extract(mo->value(0).first,"plural=","\r\n;");

                    std::string mo_encoding = extract(mo->value(0).first,"charset="," \r\n;");

                    if(mo_encoding.empty())
                        throw booster::runtime_error("Invalid mo-format, encoding is not specified");

                    if(!plural.empty()) {
                        std::unique_ptr<lambda::plural> ptr=lambda::compile(plural.c_str());
                        plural_forms_[id] = std::move(ptr);
                    }

                    if( mo_useable_directly(mo_encoding,*mo) )
                    {
                        mo_catalogs_[id]=std::move(mo);
                    }
                    else {
                        converter<CharType> cvt_value(locale_encoding,mo_encoding);
                        converter<CharType> cvt_key(key_encoding,mo_encoding);
                        for(unsigned i=0;i<mo->size();i++) {
                            char const *ckey = mo->key(i);
                            string_type skey = cvt_key(ckey,ckey+strlen(ckey));
                            key_type key(skey);
                            
                            mo_file::pair_type tmp = mo->value(i);
                            string_type value = cvt_value(tmp.first,tmp.second);
                            catalogs_[id][key].swap(value);
                        }
                    }
                    return true;

                }